

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

TranslationBlock_conflict * tcg_tb_alloc_arm(TCGContext_conflict *s)

{
  _Bool _Var1;
  long lVar2;
  TranslationBlock_conflict *pTVar3;
  void *pvVar4;
  void *next;
  TranslationBlock_conflict *tb;
  uintptr_t align;
  TCGContext_conflict *s_local;
  
  lVar2 = (long)s->uc->qemu_icache_linesize;
  do {
    pTVar3 = (TranslationBlock_conflict *)((long)s->code_gen_ptr + lVar2 + -1 & -lVar2);
    pvVar4 = (void *)((long)pTVar3 + 0x108 + -0x71 + lVar2 & -lVar2);
    if (pvVar4 <= s->code_gen_highwater) {
      s->code_gen_ptr = pvVar4;
      s->data_gen_ptr = (void *)0x0;
      return pTVar3;
    }
    _Var1 = tcg_region_alloc(s);
  } while (!_Var1);
  return (TranslationBlock_conflict *)0x0;
}

Assistant:

TranslationBlock *tcg_tb_alloc(TCGContext *s)
{
    uintptr_t align = s->uc->qemu_icache_linesize;
    TranslationBlock *tb;
    void *next;

 retry:
    tb = (void *)ROUND_UP((uintptr_t)s->code_gen_ptr, align);
    next = (void *)ROUND_UP((uintptr_t)(tb + 1), align);

    if (unlikely(next > s->code_gen_highwater)) {
        if (tcg_region_alloc(s)) {
            return NULL;
        }
        goto retry;
    }
    s->code_gen_ptr = next;
    s->data_gen_ptr = NULL;
    return tb;
}